

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O2

int field_with_index(char *opcode_bits,int index)

{
  BOOL BVar1;
  PatternRange in_RAX;
  int which;
  PatternRange range;
  
  which = 1;
  range = in_RAX;
  while( true ) {
    BVar1 = pattern_range(opcode_bits,which,&range);
    if (BVar1 == FALSE) {
      return 0;
    }
    if (range.index == index) break;
    which = which + 1;
  }
  return which;
}

Assistant:

int
field_with_index (const char *opcode_bits, int index)
{
  PatternRange range;
  int i;

  for (i = 1; pattern_range (opcode_bits, i, &range); i++)
    {
      if (range.index == index)
	return i;
    }
  return 0;
}